

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbs.cc
# Opt level: O1

int CBS_is_valid_asn1_integer(CBS *cbs,int *out_is_negative)

{
  byte bVar1;
  byte *pbVar2;
  size_t sVar3;
  uint uVar4;
  bool bVar5;
  
  pbVar2 = cbs->data;
  sVar3 = cbs->len;
  if (sVar3 == 0) {
    return 0;
  }
  bVar1 = *pbVar2;
  if (out_is_negative != (int *)0x0) {
    *out_is_negative = (uint)(bVar1 >> 7);
  }
  if (sVar3 == 1) {
    bVar5 = false;
  }
  else {
    bVar5 = -1 < (char)pbVar2[sVar3 != 0];
  }
  uVar4 = 1;
  if (sVar3 != 1) {
    if ((bool)(bVar1 == 0 & bVar5)) {
      return 0;
    }
    uVar4 = (uint)(byte)(bVar1 != 0xff | bVar5);
  }
  return uVar4;
}

Assistant:

int CBS_is_valid_asn1_integer(const CBS *cbs, int *out_is_negative) {
  CBS copy = *cbs;
  uint8_t first_byte, second_byte;
  if (!CBS_get_u8(&copy, &first_byte)) {
    return 0;  // INTEGERs may not be empty.
  }
  if (out_is_negative != NULL) {
    *out_is_negative = (first_byte & 0x80) != 0;
  }
  if (!CBS_get_u8(&copy, &second_byte)) {
    return 1;  // One byte INTEGERs are always minimal.
  }
  if ((first_byte == 0x00 && (second_byte & 0x80) == 0) ||
      (first_byte == 0xff && (second_byte & 0x80) != 0)) {
    return 0;  // The value is minimal iff the first 9 bits are not all equal.
  }
  return 1;
}